

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_rstrncasecmp(u_char *s1,u_char *s2,size_t n)

{
  byte local_2a;
  byte local_29;
  u_char c2;
  long lStack_28;
  u_char c1;
  size_t n_local;
  u_char *s2_local;
  u_char *s1_local;
  
  if (n != 0) {
    lStack_28 = n - 1;
    while( true ) {
      local_29 = s1[lStack_28];
      if ((0x60 < local_29) && (local_29 < 0x7b)) {
        local_29 = local_29 - 0x20;
      }
      local_2a = s2[lStack_28];
      if ((0x60 < local_2a) && (local_2a < 0x7b)) {
        local_2a = local_2a - 0x20;
      }
      if (local_29 != local_2a) {
        return (long)(int)((uint)local_29 - (uint)local_2a);
      }
      if (lStack_28 == 0) break;
      lStack_28 = lStack_28 + -1;
    }
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_rstrncasecmp(u_char *s1, u_char *s2, size_t n)
{
    u_char  c1, c2;

    if (n == 0) {
        return 0;
    }

    n--;

    for ( ;; ) {
        c1 = s1[n];
        if (c1 >= 'a' && c1 <= 'z') {
            c1 -= 'a' - 'A';
        }

        c2 = s2[n];
        if (c2 >= 'a' && c2 <= 'z') {
            c2 -= 'a' - 'A';
        }

        if (c1 != c2) {
            return c1 - c2;
        }

        if (n == 0) {
            return 0;
        }

        n--;
    }
}